

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

void __thiscall tinyxml2::XMLPrinter::OpenElement(XMLPrinter *this,char *name,bool compactMode)

{
  int iVar1;
  
  if (this->_elementJustOpened == true) {
    this->_elementJustOpened = false;
    Print(this,">");
  }
  DynArray<const_char_*,_10>::EnsureCapacity(&this->_stack,(this->_stack)._size + 1);
  iVar1 = (this->_stack)._size;
  (this->_stack)._size = iVar1 + 1;
  (this->_stack)._mem[iVar1] = name;
  if (((this->_textDepth < 0) && ((this->_firstElement & 1U) == 0)) && (!compactMode)) {
    Print(this,"\n");
  }
  if (!compactMode) {
    (*(this->super_XMLVisitor)._vptr_XMLVisitor[0xc])(this,(ulong)(uint)this->_depth);
  }
  Print(this,"<%s",name);
  this->_elementJustOpened = true;
  this->_firstElement = false;
  this->_depth = this->_depth + 1;
  return;
}

Assistant:

void XMLPrinter::OpenElement( const char* name, bool compactMode )
{
    SealElementIfJustOpened();
    _stack.Push( name );

    if ( _textDepth < 0 && !_firstElement && !compactMode ) {
        Print( "\n" );
    }
    if ( !compactMode ) {
        PrintSpace( _depth );
    }

    Print( "<%s", name );
    _elementJustOpened = true;
    _firstElement = false;
    ++_depth;
}